

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

pContextStackFrame create_context_stack_frame(void)

{
  pContextStackFrame pCVar1;
  
  pCVar1 = (pContextStackFrame)malloc(0x10);
  if (pCVar1 == (pContextStackFrame)0x0) {
    perror("create_context_stack_frame: malloc failed");
  }
  else {
    pCVar1->next = (pContextStackFrame)0x0;
  }
  return pCVar1;
}

Assistant:

pContextStackFrame create_context_stack_frame()
{
    pContextStackFrame res = malloc(sizeof(ContextStackFrame));
    if (res == NULL)
    {
        perror("create_context_stack_frame: malloc failed");
        return NULL;
    }
    res->next = NULL;
    return res;
}